

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O2

RtMidiIn * luaGetUserdata<RtMidiIn>(lua_State *L,int index,char *tname)

{
  RtMidiIn *pRVar1;
  int iVar2;
  undefined4 in_register_00000034;
  
  luaL_checktype(L,CONCAT44(in_register_00000034,index),7);
  iVar2 = lua_getmetatable(L,index);
  if (iVar2 == 0) {
    luaL_typerror(L,index,tname);
  }
  while (iVar2 = lua_rawequal(L,0xffffffff,0xfffffffe), iVar2 == 0) {
    iVar2 = lua_type(L,0xffffffff);
    if (iVar2 == 5) {
      lua_pushlstring(L,"__index",7);
      lua_rawget(L,0xfffffffe);
      lua_replace(L,0xfffffffe);
      iVar2 = lua_getmetatable(L,0xffffffff);
      if (iVar2 == 0) {
        luaL_typerror(L,index,tname);
      }
      lua_replace(L,0xfffffffe);
    }
    else {
      luaL_typerror(L,index,tname);
    }
  }
  lua_settop(L,0xfffffffffffffffd);
  pRVar1 = (RtMidiIn *)lua_touserdata(L,index);
  return pRVar1;
}

Assistant:

T &luaGetUserdata(lua_State *L, int index, const char *tname) {
	luaL_checktype(L, index, LUA_TUSERDATA);
	if (!lua_getmetatable(L, index))
		luaL_typerror(L, index, tname);

	while (!lua_rawequal(L, -1, -2)) {
		if (!lua_istable(L, -1))
			luaL_typerror(L, index, tname);
		else {
			// [T mt] [v.mt]
			lua_pushliteral(L, "__index");
			// [T mt] [v.mt] "__index"
			lua_rawget(L, -2);
			// [T mt] [v.mt] [v.mt].__index
			lua_replace(L, -2);
			// [T mt] [v.mt].__index
			if (!lua_getmetatable(L, -1))
				luaL_typerror(L, index, tname);
			// [T mt] [v.mt].__index getmetatable([v.mt].__index)
			lua_replace(L, -2);
			// [T mt] getmetatable([v.mt].__index)
		}
	}

	lua_pop(L, 2);
	return *reinterpret_cast<T *>(lua_touserdata(L, index));
}